

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc_test.c
# Opt level: O3

int LowMC_test_vector_192_192_4_3(void)

{
  int iVar1;
  uint8_t ciphertext_expected [24];
  uint8_t plaintext [24];
  uint8_t key [24];
  uint8_t local_58 [32];
  uint8_t local_38 [32];
  uint8_t local_18 [24];
  
  local_18[0x10] = 0x8b;
  local_18[0x11] = 'i';
  local_18[0x12] = 0xdd;
  local_18[0x13] = '\n';
  local_18[0x14] = '7';
  local_18[0x15] = 'T';
  local_18[0x16] = 0xfe;
  local_18[0x17] = '8';
  local_38[0x10] = 'J';
  local_38[0x11] = 0xcb;
  local_38[0x12] = 0x86;
  local_38[0x13] = '\x01';
  local_38[0x14] = 'A';
  local_38[0x15] = 0xb7;
  local_38[0x16] = 0xfc;
  local_38[0x17] = 'C';
  local_58[0x10] = '-';
  local_58[0x11] = 0x91;
  local_58[0x12] = 0xef;
  local_58[0x13] = '&';
  local_58[0x14] = '+';
  local_58[0x15] = 'A';
  local_58[0x16] = '\x1c';
  local_58[0x17] = 0xaf;
  local_18[0] = '$';
  local_18[1] = '\x05';
  local_18[2] = 0x97;
  local_18[3] = 0x8f;
  local_18[4] = 0xda;
  local_18[5] = 0xad;
  local_18[6] = 0x9b;
  local_18[7] = 'm';
  local_18[8] = 0x8d;
  local_18[9] = 0xcd;
  local_18[10] = 0xd1;
  local_18[0xb] = 0x8a;
  local_18[0xc] = '\f';
  local_18[0xd] = ',';
  local_18[0xe] = '\x0e';
  local_18[0xf] = 0xc6;
  local_38[0] = '3';
  local_38[1] = 0xe8;
  local_38[2] = 0xb4;
  local_38[3] = 'U';
  local_38[4] = '.';
  local_38[5] = 0x95;
  local_38[6] = 0xef;
  local_38[7] = 'R';
  local_38[8] = 'y';
  local_38[9] = 'I';
  local_38[10] = 'w';
  local_38[0xb] = '\x06';
  local_38[0xc] = 0xbc;
  local_38[0xd] = 0xe0;
  local_38[0xe] = '\x1e';
  local_38[0xf] = 0xcb;
  local_58[0] = 0xdd;
  local_58[1] = 0xaf;
  local_58[2] = '\x0f';
  local_58[3] = 0x9d;
  local_58[4] = 0x9e;
  local_58[5] = 0xdd;
  local_58[6] = 'W';
  local_58[7] = ' ';
  local_58[8] = 'i';
  local_58[9] = 0xa8;
  local_58[10] = 0x94;
  local_58[0xb] = 0x9f;
  local_58[0xc] = 0xae;
  local_58[0xd] = 0xa0;
  local_58[0xe] = 0xd1;
  local_58[0xf] = 0xfd;
  iVar1 = lowmc_enc(&parameters_192_192_4,local_18,local_38,local_58);
  return iVar1;
}

Assistant:

static int LowMC_test_vector_192_192_4_3(void) {
  const uint8_t key[24] = {
      0x24, 0x5,  0x97, 0x8f, 0xda, 0xad, 0x9b, 0x6d, 0x8d, 0xcd, 0xd1, 0x8a,
      0xc,  0x2c, 0xe,  0xc6, 0x8b, 0x69, 0xdd, 0xa,  0x37, 0x54, 0xfe, 0x38,
  };
  const uint8_t plaintext[24] = {
      0x33, 0xe8, 0xb4, 0x55, 0x2e, 0x95, 0xef, 0x52, 0x79, 0x49, 0x77, 0x6,
      0xbc, 0xe0, 0x1e, 0xcb, 0x4a, 0xcb, 0x86, 0x1,  0x41, 0xb7, 0xfc, 0x43,
  };
  const uint8_t ciphertext_expected[24] = {
      0xdd, 0xaf, 0xf,  0x9d, 0x9e, 0xdd, 0x57, 0x20, 0x69, 0xa8, 0x94, 0x9f,
      0xae, 0xa0, 0xd1, 0xfd, 0x2d, 0x91, 0xef, 0x26, 0x2b, 0x41, 0x1c, 0xaf,
  };
  return lowmc_enc(&parameters_192_192_4, key, plaintext, ciphertext_expected);
}